

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int32_t zng_inflateInit2(zng_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  int32_t iVar4;
  void *pvVar5;
  static_tree_desc *psVar6;
  ulong uVar7;
  
  (*functable.force_init)();
  if (strm == (zng_stream *)0x0) {
    iVar4 = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zng_zcalloc;
      strm->opaque = (void *)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zng_zcfree;
    }
    pvVar5 = (*strm->zalloc)(strm->opaque,1,0xa4c0);
    if (pvVar5 == (void *)0x0) {
      psVar6 = (static_tree_desc *)0x0;
    }
    else {
      uVar7 = (ulong)(-(int)pvVar5 & 0x3f);
      psVar6 = (static_tree_desc *)((long)pvVar5 + uVar7 + 0xa440);
      *(void **)((long)pvVar5 + uVar7 + 0xa440) = pvVar5;
      *(free_func *)((long)pvVar5 + uVar7 + 0xa448) = strm->zfree;
      *(ulong *)((long)pvVar5 + uVar7 + 0xa458) = (long)pvVar5 + uVar7;
      *(ulong *)((long)pvVar5 + uVar7 + 0xa450) = (long)pvVar5 + uVar7 + 0x8040;
    }
    if (psVar6 == (static_tree_desc *)0x0) {
      iVar4 = -4;
    }
    else {
      piVar1 = *(internal_state **)&psVar6->extra_base;
      uVar2 = *(undefined4 *)&psVar6->field_0x1c;
      piVar1->high_water = psVar6->max_length;
      piVar1->window_size = uVar2;
      piVar1[1].bl_desc.stat_desc = psVar6;
      piVar1->w_bits = 0x8040;
      strm->state = piVar1;
      piVar1->strm = strm;
      *(undefined4 *)&piVar1->pending_buf = 0x3f34;
      uVar3 = (*functable.chunksize)();
      *(uint32_t *)&piVar1->window = uVar3;
      iVar4 = zng_inflateReset2(strm,windowBits);
      if ((iVar4 != 0) &&
         (psVar6 = strm->state[1].bl_desc.stat_desc, psVar6 != (static_tree_desc *)0x0)) {
        (*(code *)psVar6->extra_bits)(strm->opaque,psVar6->static_tree);
        strm->state = (internal_state *)0x0;
      }
    }
  }
  return iVar4;
}

Assistant:

PREFIX(inflateInit2)(PREFIX3(stream) *strm, int32_t windowBits) {
    struct inflate_state *state;
    int32_t ret;

    /* Initialize functable */
    FUNCTABLE_INIT;

    if (strm == NULL)
        return Z_STREAM_ERROR;
    strm->msg = NULL;                   /* in case we return an error */
    if (strm->zalloc == NULL) {
        strm->zalloc = PREFIX(zcalloc);
        strm->opaque = NULL;
    }
    if (strm->zfree == NULL)
        strm->zfree = PREFIX(zcfree);

    inflate_allocs *alloc_bufs = alloc_inflate(strm);
    if (alloc_bufs == NULL)
        return Z_MEM_ERROR;

    state = alloc_bufs->state;
    state->window = alloc_bufs->window;
    state->alloc_bufs = alloc_bufs;
    state->wbufsize = INFLATE_ADJUST_WINDOW_SIZE((1 << MAX_WBITS) + 64);
    Tracev((stderr, "inflate: allocated\n"));

    strm->state = (struct internal_state *)state;
    state->strm = strm;
    state->mode = HEAD;     /* to pass state test in inflateReset2() */
    state->chunksize = FUNCTABLE_CALL(chunksize)();
    ret = PREFIX(inflateReset2)(strm, windowBits);
    if (ret != Z_OK) {
        free_inflate(strm);
    }
    return ret;
}